

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O3

string * __thiscall
HammeringPattern::get_pattern_text_repr_abi_cxx11_
          (string *__return_storage_ptr__,HammeringPattern *this)

{
  long lVar1;
  char cVar2;
  string *psVar3;
  uint uVar4;
  ostream *poVar5;
  undefined8 uVar6;
  pointer pAVar7;
  ulong uVar8;
  pointer pAVar9;
  ulong uVar10;
  stringstream local_1c0 [8];
  stringstream ss;
  long local_1b0 [2];
  ulong auStack_1a0 [12];
  ios_base local_140 [112];
  char acStack_d0 [152];
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1c0);
  if ((ulong)(((long)(this->agg_access_patterns).
                     super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->agg_access_patterns).
                     super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) < 3) {
    pAVar7 = (this->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar9 = (this->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = 2;
  }
  else {
    pAVar7 = (this->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar9 = (this->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar4 = get_num_digits((long)pAVar9 - (long)pAVar7 >> 2);
    uVar8 = (ulong)uVar4;
  }
  if (pAVar9 != pAVar7) {
    uVar10 = 0;
    do {
      cVar2 = (char)(ostream *)local_1b0;
      if ((uVar10 != 0) && (uVar10 % (ulong)(long)this->base_period == 0)) {
        std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
      }
      lVar1 = *(long *)(local_1b0[0] + -0x18);
      if (acStack_d0[lVar1 + 1] == '\0') {
        std::ios::widen(cVar2 + (char)lVar1);
        acStack_d0[lVar1 + 1] = '\x01';
      }
      acStack_d0[lVar1] = '0';
      *(ulong *)((long)auStack_1a0 + *(long *)(local_1b0[0] + -0x18)) = uVar8;
      pAVar7 = (this->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar7 >> 2) <= uVar10) {
        uVar6 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar10);
        std::__cxx11::stringstream::~stringstream(local_1c0);
        std::ios_base::~ios_base(local_140);
        _Unwind_Resume(uVar6);
      }
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,pAVar7[uVar10].id);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(this->aggressors).
                                    super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->aggressors).
                                    super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  psVar3 = local_38;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base(local_140);
  return psVar3;
}

Assistant:

std::string HammeringPattern::get_pattern_text_repr() {
  std::stringstream ss;
  // depending on the number of aggressors, decide how many digits to use to represent each aggressor ID
  // we assume that if we have more than two AggressorAccessPatterns, then it is fully filled pattern and we can just
  // use the number of aggressors as a way to determine how many digits we need, otherwise it's probably a
  // empty/prefilled pattern and we assume 2 digits (as ID_PLACEHOLDER_AGG is -1)
  auto dwidth = (agg_access_patterns.size() > 2) ? get_num_digits(aggressors.size()) : 2;
  for (size_t i = 0; i < aggressors.size(); ++i) {
    // add a new line after each base period to make it easier to check a pattern's correctness
    if ((i%base_period)==0 && i > 0) ss << std::endl;
    ss << std::setfill('0') << std::setw(dwidth) << aggressors.at(i).id << " ";
  }
  return ss.str();
}